

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenCopyMoveCtorAndAssigOpDecls
          (CppGenerator *this,StructDef *struct_def)

{
  bool bVar1;
  CodeWriter *this_00;
  allocator<char> local_d1;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  if (0 < *(int *)&(this->opts_).super_IDLOptions.field_0x30c) {
    bVar1 = NeedsCopyCtorAssignOp(this,struct_def);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"NATIVE_NAME",&local_d1);
      EscapeKeyword(&local_50,this,(string *)struct_def);
      NativeName(&local_30,&local_50,struct_def,&(this->opts_).super_IDLOptions);
      this_00 = &this->code_;
      CodeWriter::SetValue(this_00,&local_d0,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"  {{NATIVE_NAME}}(const {{NATIVE_NAME}} &o);",
                 (allocator<char> *)&local_d0);
      CodeWriter::operator+=(this_00,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,
                 "  {{NATIVE_NAME}}({{NATIVE_NAME}}&&) FLATBUFFERS_NOEXCEPT = default;",
                 (allocator<char> *)&local_d0);
      CodeWriter::operator+=(this_00,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,
                 "  {{NATIVE_NAME}} &operator=({{NATIVE_NAME}} o) FLATBUFFERS_NOEXCEPT;",
                 (allocator<char> *)&local_d0);
      CodeWriter::operator+=(this_00,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  return;
}

Assistant:

void GenCopyMoveCtorAndAssigOpDecls(const StructDef &struct_def) {
    if (opts_.g_cpp_std < cpp::CPP_STD_11) return;
    if (!NeedsCopyCtorAssignOp(struct_def)) return;
    code_.SetValue("NATIVE_NAME",
                   NativeName(Name(struct_def), &struct_def, opts_));
    code_ += "  {{NATIVE_NAME}}(const {{NATIVE_NAME}} &o);";
    code_ +=
        "  {{NATIVE_NAME}}({{NATIVE_NAME}}&&) FLATBUFFERS_NOEXCEPT = "
        "default;";
    code_ +=
        "  {{NATIVE_NAME}} &operator=({{NATIVE_NAME}} o) FLATBUFFERS_NOEXCEPT;";
  }